

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::PackSnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackSnorm4x8CaseInstance *this)

{
  ShaderExecutor *pSVar1;
  deUint32 dVar2;
  int iVar3;
  ulong uVar4;
  Hex<8UL> hex;
  int iVar5;
  int iVar6;
  Hex<8UL> hex_00;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  uint uVar25;
  uint uVar27;
  undefined1 auVar22 [16];
  int iVar26;
  int iVar28;
  uint uVar29;
  int iVar30;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar31 [16];
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  void *out;
  int aiStack_200 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  size_type asStack_1b0 [48];
  
  dVar2 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar2 ^ 0x42f2c0);
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 1;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    iVar3 = (uint)(this->m_precision == PRECISION_LOWP) * 2;
  }
  in._0_4_ = 0.0;
  in._4_4_ = 0.0;
  asStack_1b0[0]._0_4_ = 0.0;
  asStack_1b0[0]._4_4_ = 0.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0x3f800000bf800000;
  asStack_1b0[0] = 0x3f800000bf800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0xbf0000003f000000;
  asStack_1b0[0] = 0x3f000000bf000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0x3fc00000bfc00000;
  asStack_1b0[0] = 0x3fc00000bfc00000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  asStack_1b0[0]._0_4_ = -0.25;
  asStack_1b0[0]._4_4_ = 0.75;
  in = (void *)0xbf4000003e800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  iVar5 = 0xf;
  while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
    fVar15 = deRandom_getFloat(&rnd.m_rnd);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    fVar18 = deRandom_getFloat(&rnd.m_rnd);
    asStack_1b0[0]._4_4_ = fVar18 * 2.5 + -1.25;
    asStack_1b0[0]._0_4_ = fVar17 * 2.5 + -1.25;
    in = (void *)CONCAT44(fVar16 * 2.5 + -1.25,fVar15 * 2.5 + -1.25);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
               (Vector<float,_4> *)&in);
  }
  iVar5 = 0x50;
  while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
    fVar15 = deRandom_getFloat(&rnd.m_rnd);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    fVar18 = deRandom_getFloat(&rnd.m_rnd);
    asStack_1b0[0]._4_4_ = fVar18 * 1e+06 + -500000.0;
    asStack_1b0[0]._0_4_ = fVar17 * 1e+06 + -500000.0;
    in = (void *)CONCAT44(fVar16 * 1e+06 + -500000.0,fVar15 * 1e+06 + -500000.0);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
               (Vector<float,_4> *)&in);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&outputs,(long)inputs.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)asStack_1b0);
  std::operator<<((ostream *)asStack_1b0,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)asStack_1b0);
  std::operator<<((ostream *)asStack_1b0," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)asStack_1b0);
  in = inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  pSVar1 = (this->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  iVar6 = 0;
  (*pSVar1->_vptr_ShaderExecutor[2])
            (pSVar1,(ulong)((long)inputs.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4,&in,&out,0);
  uVar4 = (ulong)((long)inputs.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)inputs.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  iVar5 = (int)uVar4;
  uVar8 = 0;
  if (0 < iVar5) {
    uVar8 = uVar4 & 0xffffffff;
  }
  lVar7 = 0;
  uVar4 = 0;
  while( true ) {
    if (uVar8 == uVar4) break;
    auVar19 = *(undefined1 (*) [16])
               ((long)(inputs.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7);
    auVar22._8_4_ = 0x3f800000;
    auVar22._0_8_ = &DAT_3f8000003f800000;
    auVar22._12_4_ = 0x3f800000;
    auVar22 = minps(auVar22,auVar19);
    uVar10 = -(uint)(auVar19._0_4_ < -1.0);
    uVar11 = -(uint)(auVar19._4_4_ < -1.0);
    uVar12 = -(uint)(auVar19._8_4_ < -1.0);
    uVar13 = -(uint)(auVar19._12_4_ < -1.0);
    fVar15 = (float)(uVar10 & 0xc2fe0000 | ~uVar10 & (uint)(auVar22._0_4_ * 127.0));
    fVar16 = (float)(uVar11 & 0xc2fe0000 | ~uVar11 & (uint)(auVar22._4_4_ * 127.0));
    fVar17 = (float)(uVar12 & 0xc2fe0000 | ~uVar12 & (uint)(auVar22._8_4_ * 127.0));
    fVar18 = (float)(uVar13 & 0xc2fe0000 | ~uVar13 & (uint)(auVar22._12_4_ * 127.0));
    uVar11 = -(uint)(fVar15 < 0.0);
    uVar12 = -(uint)(fVar16 < 0.0);
    uVar13 = -(uint)(fVar17 < 0.0);
    uVar14 = -(uint)(fVar18 < 0.0);
    uVar10 = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    hex.value._4_4_ = 0;
    hex.value._0_4_ = uVar10;
    uVar11 = (uint)((float)(uVar11 & 0xbf000000 | ~uVar11 & 0x3f000000) + fVar15);
    uVar12 = (uint)((float)(uVar12 & 0xbf000000 | ~uVar12 & 0x3f000000) + fVar16);
    uVar13 = (uint)((float)(uVar13 & 0xbf000000 | ~uVar13 & 0x3f000000) + fVar17);
    uVar14 = (uint)((float)(uVar14 & 0xbf000000 | ~uVar14 & 0x3f000000) + fVar18);
    uVar20 = -(uint)((int)uVar11 < 0x7f);
    uVar25 = -(uint)((int)uVar12 < 0x7f);
    uVar27 = -(uint)((int)uVar13 < 0x7f);
    uVar29 = -(uint)((int)uVar14 < 0x7f);
    uVar11 = ~uVar20 & 0x7f | uVar11 & uVar20;
    uVar12 = ~uVar25 & 0x7f | uVar12 & uVar25;
    uVar13 = ~uVar27 & 0x7f | uVar13 & uVar27;
    uVar27 = ~uVar29 & 0x7f | uVar14 & uVar29;
    uVar14 = -(uint)(-0x80 < (int)uVar11);
    uVar20 = -(uint)(-0x80 < (int)uVar12);
    uVar25 = -(uint)(-0x80 < (int)uVar13);
    uVar35 = -(uint)(-0x80 < (int)uVar27);
    uVar32 = ~uVar20 & 0xffffff80 | uVar12 & uVar20;
    uVar29 = (~uVar14 & 0xffffff80 | uVar11 & uVar14) & 0xff;
    uVar33 = uVar32 & 0xff;
    uVar34 = (~uVar25 & 0xffffff80 | uVar13 & uVar25) & 0xff;
    uVar14 = uVar29 - (uVar10 & 0xff);
    uVar20 = uVar33 - (uVar10 >> 8 & 0xff);
    uVar25 = uVar34 - (uVar10 >> 0x10 & 0xff);
    uVar27 = ((~uVar35 & 0xffffff80 | uVar27 & uVar35) & 0xff) - (uVar10 >> 0x18);
    uVar10 = (int)uVar14 >> 0x1f;
    uVar11 = (int)uVar20 >> 0x1f;
    uVar12 = (int)uVar25 >> 0x1f;
    uVar13 = (int)uVar27 >> 0x1f;
    iVar21 = (uVar14 ^ uVar10) - uVar10;
    iVar26 = (uVar20 ^ uVar11) - uVar11;
    iVar28 = (uVar25 ^ uVar12) - uVar12;
    iVar30 = (uVar27 ^ uVar13) - uVar13;
    auVar19._0_4_ = -(uint)(iVar3 < iVar21);
    auVar19._4_4_ = -(uint)(iVar3 < iVar26);
    auVar19._8_4_ = -(uint)(iVar3 < iVar28);
    auVar19._12_4_ = -(uint)(iVar3 < iVar30);
    auVar23._4_4_ = auVar19._4_4_;
    auVar23._0_4_ = auVar19._4_4_;
    auVar23._8_4_ = auVar19._4_4_;
    auVar23._12_4_ = auVar19._4_4_;
    auVar31._4_4_ = auVar19._12_4_;
    auVar31._0_4_ = auVar19._8_4_;
    auVar31._8_4_ = auVar19._8_4_;
    auVar31._12_4_ = auVar19._12_4_;
    auVar24._4_4_ = auVar19._12_4_;
    auVar24._0_4_ = auVar19._12_4_;
    auVar24._8_4_ = auVar19._12_4_;
    auVar24._12_4_ = auVar19._12_4_;
    if (((auVar24 | auVar19 | auVar31 | auVar23) & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      if (iVar6 < 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)asStack_1b0);
        std::operator<<((ostream *)asStack_1b0,"ERROR: Mismatch in value ");
        std::ostream::operator<<((ostringstream *)asStack_1b0,(int)uVar4);
        std::operator<<((ostream *)asStack_1b0,", expected packSnorm4x8(");
        tcu::operator<<((ostream *)asStack_1b0,
                        (Vector<float,_4> *)
                        ((long)(inputs.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7));
        std::operator<<((ostream *)asStack_1b0,") = ");
        hex_00.value._4_4_ = 0;
        hex_00.value._0_4_ = uVar29 | uVar33 << 8 | uVar34 << 0x10 | uVar32 << 0x18;
        tcu::Format::operator<<((ostream *)asStack_1b0,hex_00);
        std::operator<<((ostream *)asStack_1b0,", got ");
        tcu::Format::operator<<((ostream *)asStack_1b0,hex);
        std::operator<<((ostream *)asStack_1b0,"\n  diffs = ");
        out = (void *)CONCAT44(iVar26,iVar21);
        aiStack_200[1] = iVar30;
        aiStack_200[0] = iVar28;
        tcu::operator<<((ostream *)asStack_1b0,(Vector<int,_4> *)&out);
        std::operator<<((ostream *)asStack_1b0,", max diff = ");
        std::ostream::operator<<((ostringstream *)asStack_1b0,iVar3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)asStack_1b0);
      }
      else if (iVar6 == 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)asStack_1b0);
        std::operator<<((ostream *)asStack_1b0,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)asStack_1b0);
      }
      iVar6 = iVar6 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar7 = lVar7 + 0x10;
  }
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)asStack_1b0);
  std::ostream::operator<<((ostringstream *)asStack_1b0,iVar5 - iVar6);
  std::operator<<((ostream *)asStack_1b0," / ");
  std::ostream::operator<<((ostringstream *)asStack_1b0,iVar5);
  std::operator<<((ostream *)asStack_1b0," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)asStack_1b0);
  if (iVar6 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&in,"Pass",(allocator<char> *)&out)
    ;
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&in);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in,"Result comparison failed",(allocator<char> *)&out);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&in);
  }
  std::__cxx11::string::~string((string *)&in);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&inputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		de::Random					rnd			(deStringHash(m_name) ^ 0x42f2c0);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^7) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^7) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			const float z = rnd.getFloat()*2.5f - 1.25f;
			const float w = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			const float z = rnd.getFloat()*1e6f - 0.5e6f;
			const float w = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}